

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.h
# Opt level: O0

void __thiscall crnlib::dxt_hc::color_cluster::color_cluster(color_cluster *this)

{
  color_cluster *local_50;
  color_cluster *local_28;
  color_cluster *this_local;
  
  local_28 = this;
  do {
    vector<unsigned_int>::vector(local_28->blocks);
    local_28 = (color_cluster *)(local_28->blocks + 1);
  } while (local_28 != (color_cluster *)&this->pixels);
  vector<crnlib::color_quad<unsigned_char,_int>_>::vector(&this->pixels);
  this->first_endpoint = 0;
  this->second_endpoint = 0;
  local_50 = (color_cluster *)this->color_values;
  do {
    color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)local_50);
    local_50 = (color_cluster *)
               ((anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)local_50->blocks + 1
               );
  } while (local_50 != this + 1);
  return;
}

Assistant:

color_cluster() :
                first_endpoint(0),
                second_endpoint(0)
            {
            }